

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O2

void __thiscall sign_verify::test_method(sign_verify *this)

{
  int iVar1;
  array<unsigned_char,_32UL> *container;
  pointer *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  shared_count *psVar2;
  assertion_result local_278;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_260;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  char *local_228;
  char *local_220;
  size_t siglen;
  lazy_ostream local_210;
  undefined1 *local_200;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_1f8;
  array<unsigned_char,_32UL> m;
  picnic_l1_fs_publickey_t public_key;
  picnic_l1_fs_privatekey_t private_key;
  const_string local_180;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  max_signature_size = picnic_l1_fs_signature_size();
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_50.m_begin = "";
  local_40.m_end = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x1e,&local_50);
  local_210._vptr_lazy_ostream = (_func_int **)&max_signature_size;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            ((assertion_result *)&m,(value_expr<const_unsigned_long_&> *)&local_210,false);
  private_key.data._24_8_ = &public_key;
  public_key.data._0_8_ = (long)"siglen <= max_signature_size" + 10;
  private_key.data[8] = '\0';
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_60.m_end = "";
  public_key.data._8_8_ = (long)"siglen <= max_signature_size" + 0x1c;
  private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&m,(lazy_ostream *)&private_key,&local_60,0x1e,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count((shared_count *)(m._M_elems + 0x10));
  container = &m;
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(container);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_80.m_begin = "";
  local_70.m_end = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)container,&local_70,0x26,&local_80);
  iVar1 = picnic_l1_fs_keygen(&public_key,&private_key);
  local_260.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_260,false);
  local_278._0_8_ = "!picnic_l1_fs_keygen(&public_key, &private_key)";
  local_210.m_empty = false;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_90.m_end = "";
  local_278.m_message.px = (element_type *)0x15116e;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_278;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_210,&local_90,0x26,CHECK,CHECK_BUILT_ASSERTION,0);
  this_00 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)this_00);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_b0.m_begin = "";
  local_a0.m_end = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_a0,0x29,&local_b0);
  iVar1 = picnic_l1_fs_validate_keypair(&private_key,&public_key);
  local_260.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_260,false);
  local_278._0_8_ = "!picnic_l1_fs_validate_keypair(&private_key, &public_key)";
  local_210.m_empty = false;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_c0.m_end = "";
  local_278.m_message.px = (element_type *)0x1511a8;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_278;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,&local_210,&local_c0,0x29,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = &sig;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_01,max_signature_size);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_e0.m_begin = "";
  local_d0.m_end = "";
  local_e0.m_end = "";
  siglen = max_signature_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_01,&local_d0,0x30,&local_e0);
  iVar1 = picnic_l1_fs_sign(&private_key,&m,0x20,
                            sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&siglen);
  local_228 = (char *)CONCAT71(local_228._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_278,(value_expr<bool> *)&local_228,false);
  local_260.m_lhs.m_value = (unsigned_long *)0x1511a9;
  local_210.m_empty = false;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_f0.m_end = "";
  local_260.m_rhs = (unsigned_long *)0x1511f2;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = &local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_210,&local_f0,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar2 = &local_278.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_100.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_110.m_begin = "";
  local_100.m_end = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_100,0x31,&local_110);
  local_260.m_rhs = (unsigned_long *)((ulong)local_260.m_rhs & 0xffffffff00000000);
  local_260.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_278,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_260,false);
  local_228 = "siglen > 0";
  local_210.m_empty = false;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_120.m_end = "";
  local_220 = "";
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_210,&local_120,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar2 = &local_278.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_130.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_140.m_begin = "";
  local_130.m_end = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_130,0x32,&local_140);
  local_260.m_rhs = &max_signature_size;
  local_260.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_278,&local_260,false);
  local_228 = "siglen <= max_signature_size";
  local_210.m_empty = false;
  local_150.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_150.m_end = "";
  local_220 = "";
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_228;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_210,&local_150,0x32,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar2 = &local_278.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar2);
  local_160.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_170.m_begin = "";
  local_160.m_end = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar2,&local_160,0x34,&local_170);
  iVar1 = picnic_l1_fs_verify(&public_key,&m,0x20,
                              sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,siglen);
  local_228 = (char *)CONCAT71(local_228._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_278,(value_expr<bool> *)&local_228,false);
  local_260.m_lhs.m_value = (unsigned_long *)0x15121b;
  local_210.m_empty = false;
  local_180.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_180.m_end = "";
  local_260.m_rhs = (unsigned_long *)0x151264;
  local_210._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00177d30;
  local_200 = boost::unit_test::lazy_ostream::inst;
  local_1f8 = &local_260;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_210,&local_180,0x34,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
}